

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O2

char * String::find(char *in,char c)

{
  while( true ) {
    if (*in == '\0') {
      return (char *)0x0;
    }
    if (*in == c) break;
    in = in + 1;
  }
  return in;
}

Assistant:

static const char* find(const char* in, char c)
  {
    for(; *in; ++in)
      if(*in == c)
        return in;
    return 0;
  }